

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall cmCTest::cmCTest(cmCTest *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  undefined8 *puVar3;
  bool bVar4;
  long lVar5;
  mapped_type *pmVar6;
  cmCTestBuildHandler *this_00;
  mapped_type *ppcVar7;
  cmCTestBuildAndTestHandler *this_01;
  cmCTestCoverageHandler *this_02;
  cmCTestScriptHandler *this_03;
  cmCTestTestHandler *this_04;
  cmCTestUpdateHandler *this_05;
  mapped_type this_06;
  cmCTestMemCheckHandler *this_07;
  cmCTestSubmitHandler *this_08;
  cmCTestUploadHandler *this_09;
  _Rb_tree_node_base *p_Var8;
  Part p;
  string *s;
  allocator local_a9;
  string local_a8;
  t_TestingHandlers *local_88;
  string *local_80;
  string *local_78;
  string *local_70;
  string *local_58;
  string outOnFail;
  
  (this->ConfigType)._M_dataplus._M_p = (pointer)&(this->ConfigType).field_2;
  (this->ConfigType)._M_string_length = 0;
  (this->ConfigType).field_2._M_local_buf[0] = '\0';
  (this->ScheduleType)._M_dataplus._M_p = (pointer)&(this->ScheduleType).field_2;
  (this->ScheduleType)._M_string_length = 0;
  (this->ScheduleType).field_2._M_local_buf[0] = '\0';
  (this->StopTime)._M_dataplus._M_p = (pointer)&(this->StopTime).field_2;
  (this->StopTime)._M_string_length = 0;
  (this->StopTime).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header;
  (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_80 = &this->ConfigType;
  local_70 = &this->ScheduleType;
  (this->CTestConfigFile)._M_dataplus._M_p = (pointer)&(this->CTestConfigFile).field_2;
  (this->CTestConfigFile)._M_string_length = 0;
  (this->CTestConfigFile).field_2._M_local_buf[0] = '\0';
  p_Var2 = &(this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header;
  (this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->CTestConfiguration)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header;
  (this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->CTestConfigurationOverwrites)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78 = &this->StopTime;
  local_58 = &this->CTestConfigFile;
  lVar5 = 0x160;
  do {
    puVar3 = (undefined8 *)((long)this + lVar5 + -0x27);
    *puVar3 = 0;
    puVar3[1] = 0;
    puVar3 = (undefined8 *)((long)this + lVar5 + -0x30);
    *puVar3 = 0;
    puVar3[1] = 0;
    *(long *)((long)this + lVar5 + -0x10) = (long)&this->RepeatTests + lVar5;
    *(undefined8 *)((long)this + lVar5 + -8) = 0;
    *(undefined1 *)((long)&this->RepeatTests + lVar5) = 0;
    lVar5 = lVar5 + 0x40;
  } while (lVar5 != 0x420);
  (this->PartMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->PartMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var2 = &(this->PartMap)._M_t._M_impl.super__Rb_tree_header;
  (this->PartMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->PartMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->PartMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CurrentTag)._M_dataplus._M_p = (pointer)&(this->CurrentTag).field_2;
  (this->CurrentTag)._M_string_length = 0;
  (this->CurrentTag).field_2._M_local_buf[0] = '\0';
  (this->SpecificTrack)._M_dataplus._M_p = (pointer)&(this->SpecificTrack).field_2;
  (this->SpecificTrack)._M_string_length = 0;
  (this->SpecificTrack).field_2._M_local_buf[0] = '\0';
  (this->BinaryDir)._M_dataplus._M_p = (pointer)&(this->BinaryDir).field_2;
  (this->BinaryDir)._M_string_length = 0;
  (this->BinaryDir).field_2._M_local_buf[0] = '\0';
  (this->NotesFiles)._M_dataplus._M_p = (pointer)&(this->NotesFiles).field_2;
  (this->NotesFiles)._M_string_length = 0;
  (this->NotesFiles).field_2._M_local_buf[0] = '\0';
  (this->InitialCommandLineArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->InitialCommandLineArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->InitialCommandLineArguments).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var2 = &(this->Definitions)._M_t._M_impl.super__Rb_tree_header;
  (this->Definitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Definitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->Definitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->Definitions)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->Definitions)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->ParallelLevelSetInCli = false;
  this->TestLoad = 0;
  this->SubmitIndex = 0;
  this->TomorrowTag = false;
  this->Verbose = false;
  this->Debug = false;
  this->ShowLineNumbers = false;
  this->Quiet = false;
  this->ExtraVerbose = false;
  this->ProduceXML = false;
  this->LabelSummary = true;
  this->SubprojectSummary = true;
  this->UseHTTP10 = false;
  this->PrintLabels = false;
  this->Failover = false;
  this->BatchJobs = false;
  this->ShowOnly = false;
  this->ForceNewCTestProcess = false;
  this->RunConfigurationScript = false;
  this->CompressTestOutput = true;
  this->TestModel = 0;
  local_88 = &this->TestingHandlers;
  this->MaxTestNameWidth = 0x1e;
  this->ParallelLevel = 1;
  this->InteractiveDebugMode = true;
  this->TimeOut = 0.0;
  this->GlobalTimeout = 0.0;
  this->LastStopTimeout = 0x15180;
  this->CompressXMLFiles = false;
  std::__cxx11::string::assign((char *)local_58);
  std::__cxx11::string::assign((char *)local_70);
  std::__cxx11::string::assign((char *)local_78);
  this->NextDayStopTime = false;
  this->OutputLogFile = (cmGeneratedFileStream *)0x0;
  this->OutputLogFileLastTag = -1;
  this->SuppressUpdatingCTestConfiguration = false;
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  this->OutputTestOutputOnTestFailure = false;
  this->RepeatTests = 1;
  this->RepeatUntilFail = false;
  outOnFail._M_dataplus._M_p = (pointer)&outOnFail.field_2;
  outOnFail._M_string_length = 0;
  outOnFail.field_2._M_local_buf[0] = '\0';
  bVar4 = cmsys::SystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE",&outOnFail);
  if (bVar4) {
    bVar4 = cmSystemTools::IsOff(outOnFail._M_dataplus._M_p);
    this->OutputTestOutputOnTestFailure = !bVar4;
  }
  this->StreamOut = (ostream *)&std::cout;
  this->StreamErr = (ostream *)&std::cerr;
  std::__cxx11::string::string((string *)&local_a8,"Start",&local_a9);
  s = &this->Parts[0].Name;
  std::__cxx11::string::_M_assign((string *)s);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"Update",&local_a9);
  std::__cxx11::string::_M_assign((string *)&this->Parts[1].Name);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"Configure",&local_a9);
  std::__cxx11::string::_M_assign((string *)&this->Parts[2].Name);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"Build",&local_a9);
  std::__cxx11::string::_M_assign((string *)&this->Parts[3].Name);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"Test",&local_a9);
  std::__cxx11::string::_M_assign((string *)&this->Parts[4].Name);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"Coverage",&local_a9);
  std::__cxx11::string::_M_assign((string *)&this->Parts[5].Name);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"MemCheck",&local_a9);
  std::__cxx11::string::_M_assign((string *)&this->Parts[6].Name);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"Submit",&local_a9);
  std::__cxx11::string::_M_assign((string *)&this->Parts[7].Name);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"Notes",&local_a9);
  std::__cxx11::string::_M_assign((string *)&this->Parts[8].Name);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"ExtraFiles",&local_a9);
  std::__cxx11::string::_M_assign((string *)&this->Parts[9].Name);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::string((string *)&local_a8,"Upload",&local_a9);
  std::__cxx11::string::_M_assign((string *)&this->Parts[10].Name);
  std::__cxx11::string::~string((string *)&local_a8);
  for (lVar5 = 0; lVar5 != 0xb; lVar5 = lVar5 + 1) {
    cmsys::SystemTools::LowerCase(&local_a8,s);
    pmVar6 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTest::Part>_>_>
             ::operator[](&this->PartMap,&local_a8);
    *pmVar6 = (mapped_type)lVar5;
    std::__cxx11::string::~string((string *)&local_a8);
    s = s + 2;
  }
  this->ShortDateFormat = true;
  this_00 = (cmCTestBuildHandler *)operator_new(0x3b8);
  cmCTestBuildHandler::cmCTestBuildHandler(this_00);
  std::__cxx11::string::string((string *)&local_a8,"build",&local_a9);
  ppcVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_88,&local_a8);
  *ppcVar7 = (mapped_type)this_00;
  std::__cxx11::string::~string((string *)&local_a8);
  this_01 = (cmCTestBuildAndTestHandler *)operator_new(0x280);
  cmCTestBuildAndTestHandler::cmCTestBuildAndTestHandler(this_01);
  std::__cxx11::string::string((string *)&local_a8,"buildtest",&local_a9);
  ppcVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_88,&local_a8);
  *ppcVar7 = (mapped_type)this_01;
  std::__cxx11::string::~string((string *)&local_a8);
  this_02 = (cmCTestCoverageHandler *)operator_new(0x1b8);
  cmCTestCoverageHandler::cmCTestCoverageHandler(this_02);
  std::__cxx11::string::string((string *)&local_a8,"coverage",&local_a9);
  ppcVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_88,&local_a8);
  *ppcVar7 = (mapped_type)this_02;
  std::__cxx11::string::~string((string *)&local_a8);
  this_03 = (cmCTestScriptHandler *)operator_new(0x2a8);
  cmCTestScriptHandler::cmCTestScriptHandler(this_03);
  std::__cxx11::string::string((string *)&local_a8,"script",&local_a9);
  ppcVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_88,&local_a8);
  *ppcVar7 = (mapped_type)this_03;
  std::__cxx11::string::~string((string *)&local_a8);
  this_04 = (cmCTestTestHandler *)operator_new(0x790);
  cmCTestTestHandler::cmCTestTestHandler(this_04);
  std::__cxx11::string::string((string *)&local_a8,"test",&local_a9);
  ppcVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_88,&local_a8);
  *ppcVar7 = (mapped_type)this_04;
  std::__cxx11::string::~string((string *)&local_a8);
  this_05 = (cmCTestUpdateHandler *)operator_new(0xc0);
  cmCTestUpdateHandler::cmCTestUpdateHandler(this_05);
  std::__cxx11::string::string((string *)&local_a8,"update",&local_a9);
  ppcVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_88,&local_a8);
  *ppcVar7 = (mapped_type)this_05;
  std::__cxx11::string::~string((string *)&local_a8);
  this_06 = (mapped_type)operator_new(0x98);
  cmCTestConfigureHandler::cmCTestConfigureHandler((cmCTestConfigureHandler *)this_06);
  std::__cxx11::string::string((string *)&local_a8,"configure",&local_a9);
  ppcVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_88,&local_a8);
  *ppcVar7 = this_06;
  std::__cxx11::string::~string((string *)&local_a8);
  this_07 = (cmCTestMemCheckHandler *)operator_new(0x8e8);
  cmCTestMemCheckHandler::cmCTestMemCheckHandler(this_07);
  std::__cxx11::string::string((string *)&local_a8,"memcheck",&local_a9);
  ppcVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_88,&local_a8);
  *ppcVar7 = (mapped_type)this_07;
  std::__cxx11::string::~string((string *)&local_a8);
  this_08 = (cmCTestSubmitHandler *)operator_new(0x168);
  cmCTestSubmitHandler::cmCTestSubmitHandler(this_08);
  std::__cxx11::string::string((string *)&local_a8,"submit",&local_a9);
  ppcVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_88,&local_a8);
  *ppcVar7 = (mapped_type)this_08;
  std::__cxx11::string::~string((string *)&local_a8);
  this_09 = (cmCTestUploadHandler *)operator_new(200);
  cmCTestUploadHandler::cmCTestUploadHandler(this_09);
  std::__cxx11::string::string((string *)&local_a8,"upload",&local_a9);
  ppcVar7 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestGenericHandler_*>_>_>
            ::operator[](local_88,&local_a8);
  *ppcVar7 = (mapped_type)this_09;
  std::__cxx11::string::~string((string *)&local_a8);
  for (p_Var8 = (this->TestingHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var8 != p_Var1;
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8)) {
    *(cmCTest **)(*(long *)(p_Var8 + 2) + 0x20) = this;
  }
  cmSystemTools::EnableVSConsoleOutput();
  std::__cxx11::string::~string((string *)&outOnFail);
  return;
}

Assistant:

cmCTest::cmCTest()
{
  this->LabelSummary = true;
  this->SubprojectSummary = true;
  this->ParallelLevel = 1;
  this->ParallelLevelSetInCli = false;
  this->TestLoad = 0;
  this->SubmitIndex = 0;
  this->Failover = false;
  this->BatchJobs = false;
  this->ForceNewCTestProcess = false;
  this->TomorrowTag = false;
  this->Verbose = false;

  this->Debug = false;
  this->ShowLineNumbers = false;
  this->Quiet = false;
  this->ExtraVerbose = false;
  this->ProduceXML = false;
  this->ShowOnly = false;
  this->RunConfigurationScript = false;
  this->UseHTTP10 = false;
  this->PrintLabels = false;
  this->CompressTestOutput = true;
  this->TestModel = cmCTest::EXPERIMENTAL;
  this->MaxTestNameWidth = 30;
  this->InteractiveDebugMode = true;
  this->TimeOut = 0;
  this->GlobalTimeout = 0;
  this->LastStopTimeout = 24 * 60 * 60;
  this->CompressXMLFiles = false;
  this->CTestConfigFile = "";
  this->ScheduleType = "";
  this->StopTime = "";
  this->NextDayStopTime = false;
  this->OutputLogFile = CM_NULLPTR;
  this->OutputLogFileLastTag = -1;
  this->SuppressUpdatingCTestConfiguration = false;
  this->DartVersion = 1;
  this->DropSiteCDash = false;
  this->OutputTestOutputOnTestFailure = false;
  this->RepeatTests = 1; // default to run each test once
  this->RepeatUntilFail = false;
  std::string outOnFail;
  if (cmSystemTools::GetEnv("CTEST_OUTPUT_ON_FAILURE", outOnFail)) {
    this->OutputTestOutputOnTestFailure =
      !cmSystemTools::IsOff(outOnFail.c_str());
  }
  this->InitStreams();

  this->Parts[PartStart].SetName("Start");
  this->Parts[PartUpdate].SetName("Update");
  this->Parts[PartConfigure].SetName("Configure");
  this->Parts[PartBuild].SetName("Build");
  this->Parts[PartTest].SetName("Test");
  this->Parts[PartCoverage].SetName("Coverage");
  this->Parts[PartMemCheck].SetName("MemCheck");
  this->Parts[PartSubmit].SetName("Submit");
  this->Parts[PartNotes].SetName("Notes");
  this->Parts[PartExtraFiles].SetName("ExtraFiles");
  this->Parts[PartUpload].SetName("Upload");

  // Fill the part name-to-id map.
  for (Part p = PartStart; p != PartCount; p = Part(p + 1)) {
    this->PartMap[cmSystemTools::LowerCase(this->Parts[p].GetName())] = p;
  }

  this->ShortDateFormat = true;

  this->TestingHandlers["build"] = new cmCTestBuildHandler;
  this->TestingHandlers["buildtest"] = new cmCTestBuildAndTestHandler;
  this->TestingHandlers["coverage"] = new cmCTestCoverageHandler;
  this->TestingHandlers["script"] = new cmCTestScriptHandler;
  this->TestingHandlers["test"] = new cmCTestTestHandler;
  this->TestingHandlers["update"] = new cmCTestUpdateHandler;
  this->TestingHandlers["configure"] = new cmCTestConfigureHandler;
  this->TestingHandlers["memcheck"] = new cmCTestMemCheckHandler;
  this->TestingHandlers["submit"] = new cmCTestSubmitHandler;
  this->TestingHandlers["upload"] = new cmCTestUploadHandler;

  cmCTest::t_TestingHandlers::iterator it;
  for (it = this->TestingHandlers.begin(); it != this->TestingHandlers.end();
       ++it) {
    it->second->SetCTestInstance(this);
  }

  // Make sure we can capture the build tool output.
  cmSystemTools::EnableVSConsoleOutput();
}